

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImDrawListSplitter::~ImDrawListSplitter(ImDrawListSplitter *this)

{
  ImDrawListSplitter *in_RDI;
  
  ClearFreeMemory(in_RDI);
  ImVector<ImDrawChannel>::~ImVector((ImVector<ImDrawChannel> *)in_RDI);
  return;
}

Assistant:

inline ~ImDrawListSplitter() { ClearFreeMemory(); }